

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

char * rsrc_basename(char *name,size_t name_length)

{
  void *pvVar1;
  long in_RSI;
  char *in_RDI;
  char *r;
  char *s;
  undefined8 local_18;
  
  local_18 = in_RDI;
  while( true ) {
    pvVar1 = memchr(local_18,0x2f,in_RSI - ((long)local_18 - (long)in_RDI));
    if (pvVar1 == (void *)0x0) break;
    local_18 = (char *)((long)pvVar1 + 1);
  }
  return local_18;
}

Assistant:

static const char *
rsrc_basename(const char *name, size_t name_length)
{
	const char *s, *r;

	r = s = name;
	for (;;) {
		s = memchr(s, '/', name_length - (s - name));
		if (s == NULL)
			break;
		r = ++s;
	}
	return (r);
}